

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gram.c
# Opt level: O0

void star_EBNF(Grammar *g)

{
  uint uVar1;
  Production *p;
  Rule *pRVar2;
  Elem *pEVar3;
  Rule *rr;
  Production *pp;
  Grammar *g_local;
  
  p = new_internal_production(g,g->p);
  p->field_0x3c = p->field_0x3c & 0xe3 | 0xc;
  pRVar2 = new_rule(g,p);
  if (g->right_recursive_BNF == 0) {
    if ((pRVar2->elems).v == (Elem **)0x0) {
      pEVar3 = new_elem_nterm(p,pRVar2);
      (pRVar2->elems).v = (pRVar2->elems).e;
      uVar1 = (pRVar2->elems).n;
      (pRVar2->elems).n = uVar1 + 1;
      (pRVar2->elems).e[uVar1] = pEVar3;
    }
    else if ((pRVar2->elems).v == (pRVar2->elems).e) {
      if ((pRVar2->elems).n < 3) {
        pEVar3 = new_elem_nterm(p,pRVar2);
        uVar1 = (pRVar2->elems).n;
        (pRVar2->elems).n = uVar1 + 1;
        (pRVar2->elems).v[uVar1] = pEVar3;
      }
      else {
LAB_0013eadb:
        pEVar3 = new_elem_nterm(p,pRVar2);
        vec_add_internal(&pRVar2->elems,pEVar3);
      }
    }
    else {
      if (((pRVar2->elems).n & 7) == 0) goto LAB_0013eadb;
      pEVar3 = new_elem_nterm(p,pRVar2);
      uVar1 = (pRVar2->elems).n;
      (pRVar2->elems).n = uVar1 + 1;
      (pRVar2->elems).v[uVar1] = pEVar3;
    }
    if ((pRVar2->elems).v == (Elem **)0x0) {
      pEVar3 = (g->r->elems).v[(g->r->elems).n - 1];
      (pRVar2->elems).v = (pRVar2->elems).e;
      uVar1 = (pRVar2->elems).n;
      (pRVar2->elems).n = uVar1 + 1;
      (pRVar2->elems).e[uVar1] = pEVar3;
    }
    else if ((pRVar2->elems).v == (pRVar2->elems).e) {
      if ((pRVar2->elems).n < 3) {
        pEVar3 = (g->r->elems).v[(g->r->elems).n - 1];
        uVar1 = (pRVar2->elems).n;
        (pRVar2->elems).n = uVar1 + 1;
        (pRVar2->elems).v[uVar1] = pEVar3;
      }
      else {
LAB_0013ec2a:
        vec_add_internal(&pRVar2->elems,(g->r->elems).v[(g->r->elems).n - 1]);
      }
    }
    else {
      if (((pRVar2->elems).n & 7) == 0) goto LAB_0013ec2a;
      pEVar3 = (g->r->elems).v[(g->r->elems).n - 1];
      uVar1 = (pRVar2->elems).n;
      (pRVar2->elems).n = uVar1 + 1;
      (pRVar2->elems).v[uVar1] = pEVar3;
    }
    pEVar3 = new_elem_nterm(p,g->r);
    (g->r->elems).v[(g->r->elems).n - 1] = pEVar3;
    (pRVar2->elems).v[(pRVar2->elems).n - 1]->rule = pRVar2;
  }
  else {
    if ((pRVar2->elems).v == (Elem **)0x0) {
      pEVar3 = (g->r->elems).v[(g->r->elems).n - 1];
      (pRVar2->elems).v = (pRVar2->elems).e;
      uVar1 = (pRVar2->elems).n;
      (pRVar2->elems).n = uVar1 + 1;
      (pRVar2->elems).e[uVar1] = pEVar3;
    }
    else if ((pRVar2->elems).v == (pRVar2->elems).e) {
      if ((pRVar2->elems).n < 3) {
        pEVar3 = (g->r->elems).v[(g->r->elems).n - 1];
        uVar1 = (pRVar2->elems).n;
        (pRVar2->elems).n = uVar1 + 1;
        (pRVar2->elems).v[uVar1] = pEVar3;
      }
      else {
LAB_0013ede9:
        vec_add_internal(&pRVar2->elems,(g->r->elems).v[(g->r->elems).n - 1]);
      }
    }
    else {
      if (((pRVar2->elems).n & 7) == 0) goto LAB_0013ede9;
      pEVar3 = (g->r->elems).v[(g->r->elems).n - 1];
      uVar1 = (pRVar2->elems).n;
      (pRVar2->elems).n = uVar1 + 1;
      (pRVar2->elems).v[uVar1] = pEVar3;
    }
    pEVar3 = new_elem_nterm(p,g->r);
    (g->r->elems).v[(g->r->elems).n - 1] = pEVar3;
    (pRVar2->elems).v[(pRVar2->elems).n - 1]->rule = pRVar2;
    if ((pRVar2->elems).v == (Elem **)0x0) {
      pEVar3 = new_elem_nterm(p,pRVar2);
      (pRVar2->elems).v = (pRVar2->elems).e;
      uVar1 = (pRVar2->elems).n;
      (pRVar2->elems).n = uVar1 + 1;
      (pRVar2->elems).e[uVar1] = pEVar3;
    }
    else if ((pRVar2->elems).v == (pRVar2->elems).e) {
      if ((pRVar2->elems).n < 3) {
        pEVar3 = new_elem_nterm(p,pRVar2);
        uVar1 = (pRVar2->elems).n;
        (pRVar2->elems).n = uVar1 + 1;
        (pRVar2->elems).v[uVar1] = pEVar3;
      }
      else {
LAB_0013ef5c:
        pEVar3 = new_elem_nterm(p,pRVar2);
        vec_add_internal(&pRVar2->elems,pEVar3);
      }
    }
    else {
      if (((pRVar2->elems).n & 7) == 0) goto LAB_0013ef5c;
      pEVar3 = new_elem_nterm(p,pRVar2);
      uVar1 = (pRVar2->elems).n;
      (pRVar2->elems).n = uVar1 + 1;
      (pRVar2->elems).v[uVar1] = pEVar3;
    }
  }
  if ((p->rules).v == (Rule **)0x0) {
    (p->rules).v = (p->rules).e;
    uVar1 = (p->rules).n;
    (p->rules).n = uVar1 + 1;
    (p->rules).e[uVar1] = pRVar2;
  }
  else {
    if ((p->rules).v == (p->rules).e) {
      if ((p->rules).n < 3) {
        uVar1 = (p->rules).n;
        (p->rules).n = uVar1 + 1;
        (p->rules).v[uVar1] = pRVar2;
        goto LAB_0013f057;
      }
    }
    else if (((p->rules).n & 7) != 0) {
      uVar1 = (p->rules).n;
      (p->rules).n = uVar1 + 1;
      (p->rules).v[uVar1] = pRVar2;
      goto LAB_0013f057;
    }
    vec_add_internal(&p->rules,pRVar2);
  }
LAB_0013f057:
  if ((p->rules).v == (Rule **)0x0) {
    pRVar2 = new_rule(g,p);
    (p->rules).v = (p->rules).e;
    uVar1 = (p->rules).n;
    (p->rules).n = uVar1 + 1;
    (p->rules).e[uVar1] = pRVar2;
  }
  else {
    if ((p->rules).v == (p->rules).e) {
      if ((p->rules).n < 3) {
        pRVar2 = new_rule(g,p);
        uVar1 = (p->rules).n;
        (p->rules).n = uVar1 + 1;
        (p->rules).v[uVar1] = pRVar2;
        return;
      }
    }
    else if (((p->rules).n & 7) != 0) {
      pRVar2 = new_rule(g,p);
      uVar1 = (p->rules).n;
      (p->rules).n = uVar1 + 1;
      (p->rules).v[uVar1] = pRVar2;
      return;
    }
    pRVar2 = new_rule(g,p);
    vec_add_internal(&p->rules,pRVar2);
  }
  return;
}

Assistant:

void star_EBNF(Grammar *g) {
  Production *pp;
  Rule *rr;

  pp = new_internal_production(g, g->p);
  pp->internal = INTERNAL_STAR;
  rr = new_rule(g, pp);
  if (!g->right_recursive_BNF) {
    vec_add(&rr->elems, new_elem_nterm(pp, rr));
    vec_add(&rr->elems, last_elem(g->r));
    last_elem(g->r) = new_elem_nterm(pp, g->r);
    last_elem(rr)->rule = rr;
  } else {
    vec_add(&rr->elems, last_elem(g->r));
    last_elem(g->r) = new_elem_nterm(pp, g->r);
    last_elem(rr)->rule = rr;
    vec_add(&rr->elems, new_elem_nterm(pp, rr));
  }
  vec_add(&pp->rules, rr);
  vec_add(&pp->rules, new_rule(g, pp));
}